

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

Command * __thiscall
anon_unknown.dwarf_146826::OwnershipAnalysis::includedOwnerOf
          (OwnershipAnalysis *this,StringRef inputPath)

{
  long *plVar1;
  long lVar2;
  size_t __n;
  long lVar3;
  long *plVar4;
  int iVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  Command *pCVar8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50;
  ulong local_48;
  long local_40;
  long lStack_38;
  
  p_Var7 = (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(this->includedPaths)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var9) {
    do {
      lVar2 = *(long *)(p_Var7 + 1);
      __n = *(size_t *)(lVar2 + 0x10);
      if ((__n == 0) || (*(char *)((long)*(void **)(lVar2 + 8) + (__n - 1)) != '/')) {
        lVar3 = *(long *)(lVar2 + 8);
        local_70 = &local_60;
        if (lVar3 == 0) {
          local_68 = 0;
          local_60 = 0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,lVar3,*(long *)(lVar2 + 0x10) + lVar3);
        }
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
        plVar1 = plVar6 + 2;
        if ((long *)*plVar6 == plVar1) {
          local_40 = *plVar1;
          lStack_38 = plVar6[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar1;
          local_50 = (long *)*plVar6;
        }
        plVar4 = local_50;
        local_48 = plVar6[1];
        *plVar6 = (long)plVar1;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (inputPath.Length < local_48) {
          bVar10 = false;
        }
        else if (local_48 == 0) {
          bVar10 = true;
        }
        else {
          iVar5 = bcmp(inputPath.Data,local_50,local_48);
          bVar10 = iVar5 == 0;
        }
        if (plVar4 != &local_40) {
          operator_delete(plVar4,local_40 + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
        }
LAB_0013ef61:
        if (bVar10) break;
      }
      else if (__n <= inputPath.Length) {
        iVar5 = bcmp(inputPath.Data,*(void **)(lVar2 + 8),__n);
        bVar10 = iVar5 == 0;
        goto LAB_0013ef61;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var9);
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var9) {
    pCVar8 = (Command *)0x0;
  }
  else {
    pCVar8 = (Command *)p_Var7[1]._M_parent;
  }
  return pCVar8;
}

Assistant:

Command* includedOwnerOf(StringRef inputPath) {
    auto it = std::find_if(includedPaths.begin(), includedPaths.end(), [inputPath](const std::pair<BuildNode*, Command*>& buildNodeAndCommand) -> bool {
      if (buildNodeAndCommand.first->getName().endswith("/")) {
        return inputPath.startswith(buildNodeAndCommand.first->getName());
      } else {
        return inputPath.startswith(buildNodeAndCommand.first->getName().str() + "/");
      }
    });

    if (it != includedPaths.end()) {
      return (*it).second;
    } else {
      return nullptr;
    }
  }